

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

int __thiscall SimpleLogger::LogElem::flush(LogElem *this,ofstream *fs)

{
  int iVar1;
  bool bVar2;
  
  LOCK();
  bVar2 = (this->status)._M_i == DIRTY;
  if (bVar2) {
    (this->status)._M_i = FLUSHING;
  }
  UNLOCK();
  iVar1 = -1;
  if (bVar2) {
    std::ostream::write((char *)fs,(long)this->ctx);
    iVar1 = 0;
    LOCK();
    (this->status)._M_i = CLEAN;
    UNLOCK();
  }
  return iVar1;
}

Assistant:

int SimpleLogger::LogElem::flush(std::ofstream& fs) {
    Status exp = DIRTY;
    Status val = FLUSHING;
    if (!status.compare_exchange_strong(exp, val)) return -1;

    fs.write(ctx, len);

    status.store(LogElem::CLEAN);
    return 0;
}